

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Visitor<wasm::PrintExpressionContents,_void>::visit
          (Visitor<wasm::PrintExpressionContents,_void> *this,Expression *curr)

{
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      PrintExpressionContents::visitBlock((PrintExpressionContents *)this,(Block *)curr);
      return;
    case IfId:
      PrintExpressionContents::visitIf((PrintExpressionContents *)this,(If *)curr);
      return;
    case LoopId:
      PrintExpressionContents::visitLoop((PrintExpressionContents *)this,(Loop *)curr);
      return;
    case BreakId:
      PrintExpressionContents::visitBreak((PrintExpressionContents *)this,(Break *)curr);
      return;
    case SwitchId:
      PrintExpressionContents::visitSwitch((PrintExpressionContents *)this,(Switch *)curr);
      return;
    case CallId:
      PrintExpressionContents::visitCall((PrintExpressionContents *)this,(Call *)curr);
      return;
    case CallIndirectId:
      PrintExpressionContents::visitCallIndirect
                ((PrintExpressionContents *)this,(CallIndirect *)curr);
      return;
    case LocalGetId:
      PrintExpressionContents::visitLocalGet((PrintExpressionContents *)this,(LocalGet *)curr);
      return;
    case LocalSetId:
      PrintExpressionContents::visitLocalSet((PrintExpressionContents *)this,(LocalSet *)curr);
      return;
    case GlobalGetId:
      PrintExpressionContents::visitGlobalGet((PrintExpressionContents *)this,(GlobalGet *)curr);
      return;
    case GlobalSetId:
      PrintExpressionContents::visitGlobalSet((PrintExpressionContents *)this,(GlobalSet *)curr);
      return;
    case LoadId:
      PrintExpressionContents::visitLoad((PrintExpressionContents *)this,(Load *)curr);
      return;
    case StoreId:
      PrintExpressionContents::visitStore((PrintExpressionContents *)this,(Store *)curr);
      return;
    case ConstId:
      PrintExpressionContents::visitConst((PrintExpressionContents *)this,(Const *)curr);
      return;
    case UnaryId:
      PrintExpressionContents::visitUnary((PrintExpressionContents *)this,(Unary *)curr);
      return;
    case BinaryId:
      PrintExpressionContents::visitBinary((PrintExpressionContents *)this,(Binary *)curr);
      return;
    case SelectId:
      PrintExpressionContents::visitSelect((PrintExpressionContents *)this,(Select *)curr);
      return;
    case DropId:
      PrintExpressionContents::visitDrop((PrintExpressionContents *)this,(Drop *)curr);
      return;
    case ReturnId:
      PrintExpressionContents::visitReturn((PrintExpressionContents *)this,(Return *)curr);
      return;
    case MemorySizeId:
      PrintExpressionContents::visitMemorySize((PrintExpressionContents *)this,(MemorySize *)curr);
      return;
    case MemoryGrowId:
      PrintExpressionContents::visitMemoryGrow((PrintExpressionContents *)this,(MemoryGrow *)curr);
      return;
    case NopId:
      PrintExpressionContents::visitNop((PrintExpressionContents *)this,(Nop *)curr);
      return;
    case UnreachableId:
      PrintExpressionContents::visitUnreachable((PrintExpressionContents *)this,(Unreachable *)curr)
      ;
      return;
    case AtomicRMWId:
      PrintExpressionContents::visitAtomicRMW((PrintExpressionContents *)this,(AtomicRMW *)curr);
      return;
    case AtomicCmpxchgId:
      PrintExpressionContents::visitAtomicCmpxchg
                ((PrintExpressionContents *)this,(AtomicCmpxchg *)curr);
      return;
    case AtomicWaitId:
      PrintExpressionContents::visitAtomicWait((PrintExpressionContents *)this,(AtomicWait *)curr);
      return;
    case AtomicNotifyId:
      PrintExpressionContents::visitAtomicNotify
                ((PrintExpressionContents *)this,(AtomicNotify *)curr);
      return;
    case AtomicFenceId:
      PrintExpressionContents::visitAtomicFence((PrintExpressionContents *)this,(AtomicFence *)curr)
      ;
      return;
    case SIMDExtractId:
      PrintExpressionContents::visitSIMDExtract((PrintExpressionContents *)this,(SIMDExtract *)curr)
      ;
      return;
    case SIMDReplaceId:
      PrintExpressionContents::visitSIMDReplace((PrintExpressionContents *)this,(SIMDReplace *)curr)
      ;
      return;
    case SIMDShuffleId:
      PrintExpressionContents::visitSIMDShuffle((PrintExpressionContents *)this,(SIMDShuffle *)curr)
      ;
      return;
    case SIMDTernaryId:
      PrintExpressionContents::visitSIMDTernary((PrintExpressionContents *)this,(SIMDTernary *)curr)
      ;
      return;
    case SIMDShiftId:
      PrintExpressionContents::visitSIMDShift((PrintExpressionContents *)this,(SIMDShift *)curr);
      return;
    case SIMDLoadId:
      PrintExpressionContents::visitSIMDLoad((PrintExpressionContents *)this,(SIMDLoad *)curr);
      return;
    case SIMDLoadStoreLaneId:
      PrintExpressionContents::visitSIMDLoadStoreLane
                ((PrintExpressionContents *)this,(SIMDLoadStoreLane *)curr);
      return;
    case MemoryInitId:
      PrintExpressionContents::visitMemoryInit((PrintExpressionContents *)this,(MemoryInit *)curr);
      return;
    case DataDropId:
      PrintExpressionContents::visitDataDrop((PrintExpressionContents *)this,(DataDrop *)curr);
      return;
    case MemoryCopyId:
      PrintExpressionContents::visitMemoryCopy((PrintExpressionContents *)this,(MemoryCopy *)curr);
      return;
    case MemoryFillId:
      PrintExpressionContents::visitMemoryFill((PrintExpressionContents *)this,(MemoryFill *)curr);
      return;
    case PopId:
      PrintExpressionContents::visitPop((PrintExpressionContents *)this,(Pop *)curr);
      return;
    case RefNullId:
      PrintExpressionContents::visitRefNull((PrintExpressionContents *)this,(RefNull *)curr);
      return;
    case RefIsNullId:
      PrintExpressionContents::visitRefIsNull((PrintExpressionContents *)this,(RefIsNull *)curr);
      return;
    case RefFuncId:
      PrintExpressionContents::visitRefFunc((PrintExpressionContents *)this,(RefFunc *)curr);
      return;
    case RefEqId:
      PrintExpressionContents::visitRefEq((PrintExpressionContents *)this,(RefEq *)curr);
      return;
    case TableGetId:
      PrintExpressionContents::visitTableGet((PrintExpressionContents *)this,(TableGet *)curr);
      return;
    case TableSetId:
      PrintExpressionContents::visitTableSet((PrintExpressionContents *)this,(TableSet *)curr);
      return;
    case TableSizeId:
      PrintExpressionContents::visitTableSize((PrintExpressionContents *)this,(TableSize *)curr);
      return;
    case TableGrowId:
      PrintExpressionContents::visitTableGrow((PrintExpressionContents *)this,(TableGrow *)curr);
      return;
    case TableFillId:
      PrintExpressionContents::visitTableFill((PrintExpressionContents *)this,(TableFill *)curr);
      return;
    case TableCopyId:
      PrintExpressionContents::visitTableCopy((PrintExpressionContents *)this,(TableCopy *)curr);
      return;
    case TableInitId:
      PrintExpressionContents::visitTableInit((PrintExpressionContents *)this,(TableInit *)curr);
      return;
    case TryId:
      PrintExpressionContents::visitTry((PrintExpressionContents *)this,(Try *)curr);
      return;
    case TryTableId:
      PrintExpressionContents::visitTryTable((PrintExpressionContents *)this,(TryTable *)curr);
      return;
    case ThrowId:
      PrintExpressionContents::visitThrow((PrintExpressionContents *)this,(Throw *)curr);
      return;
    case RethrowId:
      PrintExpressionContents::visitRethrow((PrintExpressionContents *)this,(Rethrow *)curr);
      return;
    case ThrowRefId:
      PrintExpressionContents::visitThrowRef((PrintExpressionContents *)this,(ThrowRef *)curr);
      return;
    case TupleMakeId:
      PrintExpressionContents::visitTupleMake((PrintExpressionContents *)this,(TupleMake *)curr);
      return;
    case TupleExtractId:
      PrintExpressionContents::visitTupleExtract
                ((PrintExpressionContents *)this,(TupleExtract *)curr);
      return;
    case RefI31Id:
      PrintExpressionContents::visitRefI31((PrintExpressionContents *)this,(RefI31 *)curr);
      return;
    case I31GetId:
      PrintExpressionContents::visitI31Get((PrintExpressionContents *)this,(I31Get *)curr);
      return;
    case CallRefId:
      PrintExpressionContents::visitCallRef((PrintExpressionContents *)this,(CallRef *)curr);
      return;
    case RefTestId:
      PrintExpressionContents::visitRefTest((PrintExpressionContents *)this,(RefTest *)curr);
      return;
    case RefCastId:
      PrintExpressionContents::visitRefCast((PrintExpressionContents *)this,(RefCast *)curr);
      return;
    case BrOnId:
      PrintExpressionContents::visitBrOn((PrintExpressionContents *)this,(BrOn *)curr);
      return;
    case StructNewId:
      PrintExpressionContents::visitStructNew((PrintExpressionContents *)this,(StructNew *)curr);
      return;
    case StructGetId:
      PrintExpressionContents::visitStructGet((PrintExpressionContents *)this,(StructGet *)curr);
      return;
    case StructSetId:
      PrintExpressionContents::visitStructSet((PrintExpressionContents *)this,(StructSet *)curr);
      return;
    case StructRMWId:
      PrintExpressionContents::visitStructRMW((PrintExpressionContents *)this,(StructRMW *)curr);
      return;
    case StructCmpxchgId:
      PrintExpressionContents::visitStructCmpxchg
                ((PrintExpressionContents *)this,(StructCmpxchg *)curr);
      return;
    case ArrayNewId:
      PrintExpressionContents::visitArrayNew((PrintExpressionContents *)this,(ArrayNew *)curr);
      return;
    case ArrayNewDataId:
      PrintExpressionContents::visitArrayNewData
                ((PrintExpressionContents *)this,(ArrayNewData *)curr);
      return;
    case ArrayNewElemId:
      PrintExpressionContents::visitArrayNewElem
                ((PrintExpressionContents *)this,(ArrayNewElem *)curr);
      return;
    case ArrayNewFixedId:
      PrintExpressionContents::visitArrayNewFixed
                ((PrintExpressionContents *)this,(ArrayNewFixed *)curr);
      return;
    case ArrayGetId:
      PrintExpressionContents::visitArrayGet((PrintExpressionContents *)this,(ArrayGet *)curr);
      return;
    case ArraySetId:
      PrintExpressionContents::visitArraySet((PrintExpressionContents *)this,(ArraySet *)curr);
      return;
    case ArrayLenId:
      PrintExpressionContents::visitArrayLen((PrintExpressionContents *)this,(ArrayLen *)curr);
      return;
    case ArrayCopyId:
      PrintExpressionContents::visitArrayCopy((PrintExpressionContents *)this,(ArrayCopy *)curr);
      return;
    case ArrayFillId:
      PrintExpressionContents::visitArrayFill((PrintExpressionContents *)this,(ArrayFill *)curr);
      return;
    case ArrayInitDataId:
      PrintExpressionContents::visitArrayInitData
                ((PrintExpressionContents *)this,(ArrayInitData *)curr);
      return;
    case ArrayInitElemId:
      PrintExpressionContents::visitArrayInitElem
                ((PrintExpressionContents *)this,(ArrayInitElem *)curr);
      return;
    case RefAsId:
      PrintExpressionContents::visitRefAs((PrintExpressionContents *)this,(RefAs *)curr);
      return;
    case StringNewId:
      PrintExpressionContents::visitStringNew((PrintExpressionContents *)this,(StringNew *)curr);
      return;
    case StringConstId:
      PrintExpressionContents::visitStringConst((PrintExpressionContents *)this,(StringConst *)curr)
      ;
      return;
    case StringMeasureId:
      PrintExpressionContents::visitStringMeasure
                ((PrintExpressionContents *)this,(StringMeasure *)curr);
      return;
    case StringEncodeId:
      PrintExpressionContents::visitStringEncode
                ((PrintExpressionContents *)this,(StringEncode *)curr);
      return;
    case StringConcatId:
      PrintExpressionContents::visitStringConcat
                ((PrintExpressionContents *)this,(StringConcat *)curr);
      return;
    case StringEqId:
      PrintExpressionContents::visitStringEq((PrintExpressionContents *)this,(StringEq *)curr);
      return;
    case StringWTF16GetId:
      PrintExpressionContents::visitStringWTF16Get
                ((PrintExpressionContents *)this,(StringWTF16Get *)curr);
      return;
    case StringSliceWTFId:
      PrintExpressionContents::visitStringSliceWTF
                ((PrintExpressionContents *)this,(StringSliceWTF *)curr);
      return;
    case ContNewId:
      PrintExpressionContents::visitContNew((PrintExpressionContents *)this,(ContNew *)curr);
      return;
    case ContBindId:
      PrintExpressionContents::visitContBind((PrintExpressionContents *)this,(ContBind *)curr);
      return;
    case SuspendId:
      PrintExpressionContents::visitSuspend((PrintExpressionContents *)this,(Suspend *)curr);
      return;
    case ResumeId:
      PrintExpressionContents::visitResume((PrintExpressionContents *)this,(Resume *)curr);
      return;
    case ResumeThrowId:
      PrintExpressionContents::visitResumeThrow((PrintExpressionContents *)this,(ResumeThrow *)curr)
      ;
      return;
    case StackSwitchId:
      PrintExpressionContents::visitStackSwitch((PrintExpressionContents *)this,(StackSwitch *)curr)
      ;
      return;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::PrintExpressionContents>::visit(Expression *) [SubType = wasm::PrintExpressionContents, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }